

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instance.cpp
# Opt level: O1

Ptr<Instance> __thiscall
myvk::Instance::CreateWithGlfwExtensions
          (Instance *this,bool use_validation_layer,
          PFN_vkDebugUtilsMessengerCallbackEXT debug_callback)

{
  element_type *peVar1;
  VkResult VVar2;
  char **__first;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  Ptr<Instance> PVar4;
  shared_ptr<myvk::Instance> ret;
  uint32_t glfw_extension_count;
  vector<const_char_*,_std::allocator<const_char_*>_> extensions;
  VkValidationFeaturesEXT validation_features;
  VkInstanceCreateInfo create_info;
  VkValidationFeatureEnableEXT validation_features_enabled [2];
  VkDebugUtilsMessengerCreateInfoEXT debug_info;
  _func_int **local_138;
  element_type *peStack_130;
  uint32_t local_124;
  char **local_120;
  long local_118;
  long local_110;
  char *local_108;
  allocator_type *paStack_100;
  undefined8 local_f8;
  undefined8 *puStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  VkInstanceCreateInfo local_d8;
  undefined8 local_90;
  VkDebugUtilsMessengerCreateInfoEXT local_88;
  VkApplicationInfo local_58;
  
  std::__shared_ptr<myvk::Instance,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<myvk::Instance>>
            ((__shared_ptr<myvk::Instance,(__gnu_cxx::_Lock_policy)2> *)&local_138,
             (allocator<myvk::Instance> *)&local_d8);
  local_d8.pApplicationInfo = &local_58;
  local_58.pEngineName = (char *)0x0;
  local_58.pApplicationName = (char *)0x0;
  local_58.applicationVersion = 0;
  local_58._28_4_ = 0;
  local_58.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  local_58._4_4_ = 0;
  local_58.pNext = (void *)0x0;
  local_58.engineVersion = 0;
  local_58.apiVersion = 0x403000;
  local_d8.pNext = (allocator_type *)0x0;
  local_d8.flags = 0;
  local_d8._20_4_ = 0;
  local_d8.enabledExtensionCount = 0;
  local_d8._52_4_ = 0;
  local_d8.ppEnabledExtensionNames = (char **)0x0;
  local_d8.enabledLayerCount = 0;
  local_d8._36_4_ = 0;
  local_d8.ppEnabledLayerNames = (char **)0x0;
  local_d8.sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
  local_d8._4_4_ = 0;
  local_124 = 0;
  __first = glfwGetRequiredInstanceExtensions(&local_124);
  std::vector<char_const*,std::allocator<char_const*>>::vector<char_const**,void>
            ((vector<char_const*,std::allocator<char_const*>> *)&local_120,__first,
             __first + local_124,(allocator_type *)&local_108);
  if (use_validation_layer) {
    local_108 = "VK_EXT_debug_utils";
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&local_120,&local_108);
  }
  local_d8.enabledExtensionCount = (uint32_t)((ulong)(local_118 - (long)local_120) >> 3);
  local_d8.ppEnabledExtensionNames = local_120;
  puStack_f0 = &local_90;
  local_90 = 0x400000002;
  paStack_100 = (allocator_type *)0x0;
  local_e8 = 0;
  uStack_e0 = 0;
  local_108 = (char *)0x3b9e8ed8;
  local_f8 = 2;
  if (use_validation_layer) {
    local_d8.enabledLayerCount = 1;
    local_d8.ppEnabledLayerNames = &kValidationLayers;
    paStack_100 = (allocator_type *)local_d8.pNext;
    local_d8.pNext = (allocator_type *)&local_108;
  }
  else {
    local_d8._32_8_ = (ulong)(uint)local_d8._36_4_ << 0x20;
  }
  if (vkCreateInstance == (PFN_vkCreateInstance)0x0) {
    VVar2 = volkInitialize();
    _Var3._M_pi = extraout_RDX_02;
    if (VVar2 == VK_SUCCESS) goto LAB_001a784b;
  }
  else {
LAB_001a784b:
    VVar2 = (*vkCreateInstance)(&local_d8,(VkAllocationCallbacks *)0x0,(VkInstance *)(local_138 + 3)
                               );
    _Var3._M_pi = extraout_RDX;
    if (VVar2 == VK_SUCCESS) {
      volkLoadInstanceOnly((VkInstance)local_138[3]);
      _Var3._M_pi = extraout_RDX_00;
      if (use_validation_layer && debug_callback != (PFN_vkDebugUtilsMessengerCallbackEXT)0x0) {
        local_88.pNext = (void *)0x0;
        local_88.flags = 0;
        local_88._28_4_ = 0;
        local_88.sType = VK_STRUCTURE_TYPE_DEBUG_UTILS_MESSENGER_CREATE_INFO_EXT;
        local_88._4_4_ = 0;
        local_88.messageSeverity = 0x1111;
        local_88.messageType = 7;
        local_88.pUserData = (void *)0x0;
        local_88.pfnUserCallback = debug_callback;
        VVar2 = (*vkCreateDebugUtilsMessengerEXT)
                          ((VkInstance)local_138[3],&local_88,(VkAllocationCallbacks *)0x0,
                           (VkDebugUtilsMessengerEXT *)(local_138 + 4));
        _Var3._M_pi = extraout_RDX_01;
        if (VVar2 != VK_SUCCESS) goto LAB_001a78f7;
      }
      peVar1 = peStack_130;
      (this->super_Base).super_enable_shared_from_this<myvk::Base>._M_weak_this.
      super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
      peStack_130 = (element_type *)0x0;
      (this->super_Base)._vptr_Base = local_138;
      (this->super_Base).super_enable_shared_from_this<myvk::Base>._M_weak_this.
      super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
      local_138 = (_func_int **)0x0;
      goto LAB_001a78fd;
    }
  }
LAB_001a78f7:
  (this->super_Base)._vptr_Base = (_func_int **)0x0;
  (this->super_Base).super_enable_shared_from_this<myvk::Base>._M_weak_this.
  super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
LAB_001a78fd:
  if (local_120 != (char **)0x0) {
    operator_delete(local_120,local_110 - (long)local_120);
    _Var3._M_pi = extraout_RDX_03;
  }
  if (peStack_130 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peStack_130);
    _Var3._M_pi = extraout_RDX_04;
  }
  PVar4.super___shared_ptr<myvk::Instance,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  PVar4.super___shared_ptr<myvk::Instance,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr<Instance>)PVar4.super___shared_ptr<myvk::Instance,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<Instance> Instance::CreateWithGlfwExtensions(bool use_validation_layer,
                                                 PFN_vkDebugUtilsMessengerCallbackEXT debug_callback) {
	auto ret = std::make_shared<Instance>();

	VkApplicationInfo app_info = {};
	app_info.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
	app_info.apiVersion = VK_API_VERSION_1_3;

	VkInstanceCreateInfo create_info = {};
	create_info.sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
	create_info.pApplicationInfo = &app_info;

	uint32_t glfw_extension_count = 0;
	const char **glfw_extensions = glfwGetRequiredInstanceExtensions(&glfw_extension_count);
	std::vector<const char *> extensions(glfw_extensions, glfw_extensions + glfw_extension_count);
	if (use_validation_layer)
		extensions.push_back(VK_EXT_DEBUG_UTILS_EXTENSION_NAME);

	create_info.enabledExtensionCount = extensions.size();
	create_info.ppEnabledExtensionNames = extensions.data();

	VkValidationFeatureEnableEXT validation_features_enabled[] = {
	    VK_VALIDATION_FEATURE_ENABLE_BEST_PRACTICES_EXT, VK_VALIDATION_FEATURE_ENABLE_SYNCHRONIZATION_VALIDATION_EXT};
	VkValidationFeaturesEXT validation_features = {};
	validation_features.sType = VK_STRUCTURE_TYPE_VALIDATION_FEATURES_EXT;
	validation_features.enabledValidationFeatureCount =
	    sizeof(validation_features_enabled) / sizeof(VkValidationFeatureEnableEXT);
	validation_features.pEnabledValidationFeatures = validation_features_enabled;

	if (use_validation_layer) {
		create_info.enabledLayerCount = sizeof(kValidationLayers) / sizeof(const char *);
		create_info.ppEnabledLayerNames = kValidationLayers;

		validation_features.pNext = create_info.pNext;
		create_info.pNext = &validation_features;
	} else
		create_info.enabledLayerCount = 0;

	if (vkCreateInstance == nullptr) {
		if (volkInitialize() != VK_SUCCESS)
			return nullptr;
	}

	if (vkCreateInstance(&create_info, nullptr, &ret->m_instance) != VK_SUCCESS)
		return nullptr;
	volkLoadInstanceOnly(ret->m_instance);

	if (use_validation_layer && debug_callback) {
		VkDebugUtilsMessengerCreateInfoEXT debug_info = {};
		debug_info.sType = VK_STRUCTURE_TYPE_DEBUG_UTILS_MESSENGER_CREATE_INFO_EXT;
		debug_info.messageSeverity =
		    VK_DEBUG_UTILS_MESSAGE_SEVERITY_VERBOSE_BIT_EXT | VK_DEBUG_UTILS_MESSAGE_SEVERITY_WARNING_BIT_EXT |
		    VK_DEBUG_UTILS_MESSAGE_SEVERITY_ERROR_BIT_EXT | VK_DEBUG_UTILS_MESSAGE_SEVERITY_INFO_BIT_EXT;
		debug_info.messageType = VK_DEBUG_UTILS_MESSAGE_TYPE_GENERAL_BIT_EXT |
		                         VK_DEBUG_UTILS_MESSAGE_TYPE_VALIDATION_BIT_EXT |
		                         VK_DEBUG_UTILS_MESSAGE_TYPE_PERFORMANCE_BIT_EXT;
		debug_info.pfnUserCallback = debug_callback;
		debug_info.pUserData = nullptr;

		if (vkCreateDebugUtilsMessengerEXT(ret->m_instance, &debug_info, nullptr, &ret->m_debug_messenger) !=
		    VK_SUCCESS)
			return nullptr;
	}

	return ret;
}